

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

int __thiscall HModel::util_chgRowBoundsAll(HModel *this,double *XrowLower,double *XrowUpper)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  int iVar4;
  ulong in_RAX;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  
  iVar4 = (int)in_RAX;
  uVar5 = (ulong)this->numRow;
  bVar8 = 0 < (long)uVar5;
  if (0 < (long)uVar5) {
    pdVar1 = (this->rowScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = 0;
    uVar6 = 1;
    do {
      dVar11 = XrowLower[uVar6 - 1];
      if (1e+200 <= dVar11) {
        bVar9 = false;
        in_RAX = uVar6 & 0xffffffff;
      }
      else {
        dVar10 = XrowUpper[uVar6 - 1];
        if (dVar10 <= -1e+200) {
          in_RAX = (ulong)~uVar7;
          bVar9 = false;
        }
        else {
          if (-1e+200 < dVar11) {
            dVar11 = dVar11 / pdVar1[uVar6 - 1];
          }
          pdVar2[uVar6 - 1] = dVar11;
          if (dVar10 < 1e+200) {
            dVar10 = dVar10 / pdVar1[uVar6 - 1];
          }
          pdVar3[uVar6 - 1] = dVar10;
          bVar9 = true;
        }
      }
      iVar4 = (int)in_RAX;
      if (!bVar9) break;
      uVar7 = uVar7 + 1;
      bVar8 = uVar6 < uVar5;
      bVar9 = uVar6 != uVar5;
      uVar6 = uVar6 + 1;
    } while (bVar9);
  }
  if (!bVar8) {
    mlFg_Update(this,this->mlFg_action_NewBounds);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int HModel::util_chgRowBoundsAll(const double* XrowLower, const double* XrowUpper) {
  assert(XrowLower != NULL);
  assert(XrowUpper != NULL);
  for (int row = 0; row < numRow; ++row) {
    double lower = XrowLower[row];
    double upper = XrowUpper[row];
    //Check that the lower bound is not being set to +Inf
    if (hsol_isInfinity(lower)) return row+1;
    //Check that the lower bound is not being set to +Inf
    if (hsol_isInfinity(-upper)) return -(row+1);
    rowLower[row] = (hsol_isInfinity(-lower) ? lower : lower / rowScale[row]);
    rowUpper[row] = (hsol_isInfinity( upper) ? upper : upper / rowScale[row]);
  }
  //Deduce the consequences of new bounds
  mlFg_Update(mlFg_action_NewBounds);
  return 0;  
}